

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  void *pvVar1;
  ssl_connect_data *connssl;
  undefined8 *puVar2;
  curl_trc_feat *pcVar3;
  ossl_ctx *octx;
  ssl_peer *psVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  uint err;
  timediff_t tVar9;
  ssl_config_data *psVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  SSL_CIPHER *c;
  char *pcVar14;
  char *pcVar15;
  size_t alpn_len;
  BIO_METHOD *type;
  BIO *pBVar16;
  uint *puVar17;
  ulong error;
  int *piVar18;
  uint local_19c;
  int *local_198;
  _Bool *local_190;
  int psigtype_nid;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uchar *neg_protocol;
  uchar auStack_130 [28];
  int iStack_114;
  
  pvVar1 = cf->ctx;
  uVar5 = Curl_conn_cf_get_socket(cf,data);
  *(undefined4 *)((long)pvVar1 + 0xb4) = 0;
  if (*(int *)((long)pvVar1 + 0xa8) == 3) {
    *done = true;
  }
  else {
    local_190 = done;
    if (*(int *)((long)pvVar1 + 0xac) == 0) {
      tVar9 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar9 < 0) {
LAB_00168bcb:
        Curl_failf(data,"SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      psVar4 = (ssl_peer *)cf->ctx;
      octx = (ossl_ctx *)psVar4[1].dispname;
      auStack_130[0x18] = '\0';
      auStack_130._25_3_ = 0;
      iStack_114 = 0;
      auStack_130[8] = '\0';
      auStack_130[9] = '\0';
      auStack_130[10] = '\0';
      auStack_130[0xb] = '\0';
      auStack_130[0xc] = '\0';
      auStack_130[0xd] = '\0';
      auStack_130[0xe] = '\0';
      auStack_130[0xf] = '\0';
      auStack_130[0x10] = '\0';
      auStack_130[0x11] = '\0';
      auStack_130[0x12] = '\0';
      auStack_130[0x13] = '\0';
      auStack_130[0x14] = '\0';
      auStack_130[0x15] = '\0';
      auStack_130[0x16] = '\0';
      auStack_130[0x17] = '\0';
      neg_protocol = (uchar *)0x0;
      auStack_130[0] = '\0';
      auStack_130[1] = '\0';
      auStack_130[2] = '\0';
      auStack_130[3] = '\0';
      auStack_130[4] = '\0';
      auStack_130[5] = '\0';
      auStack_130[6] = '\0';
      auStack_130[7] = '\0';
      if ((alpn_spec *)psVar4[1].hostname == (alpn_spec *)0x0) {
        alpn_len = 0;
      }
      else {
        CVar8 = Curl_alpn_to_proto_buf
                          ((alpn_proto_buf *)&neg_protocol,(alpn_spec *)psVar4[1].hostname);
        if (CVar8 != CURLE_OK) {
          Curl_failf(data,"Error determining ALPN");
          return CURLE_SSL_CONNECT_ERROR;
        }
        alpn_len = (size_t)iStack_114;
      }
      CVar8 = Curl_ossl_ctx_init(octx,cf,data,psVar4,3,(uchar *)&neg_protocol,alpn_len,
                                 (Curl_ossl_ctx_setup_cb *)0x0,(void *)0x0,ossl_new_session_cb,cf);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      type = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
      if (type == (BIO_METHOD *)0x0) {
        octx->bio_method = (BIO_METHOD *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      BIO_meth_set_write(type,ossl_bio_cf_out_write);
      BIO_meth_set_read(type,ossl_bio_cf_in_read);
      BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
      BIO_meth_set_create(type,ossl_bio_cf_create);
      BIO_meth_set_destroy(type,ossl_bio_cf_destroy);
      octx->bio_method = (BIO_METHOD *)type;
      pBVar16 = BIO_new(type);
      if (pBVar16 == (BIO *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      BIO_set_data(pBVar16,cf);
      BIO_up_ref(pBVar16);
      SSL_set0_rbio(octx->ssl,pBVar16);
      SSL_set0_wbio(octx->ssl,pBVar16);
      if (((((alpn_spec *)psVar4[1].hostname != (alpn_spec *)0x0) &&
           (Curl_alpn_to_proto_str((alpn_proto_buf *)&neg_protocol,(alpn_spec *)psVar4[1].hostname),
           data != (Curl_easy *)0x0)) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        Curl_infof(data,"ALPN: curl offers %s",&neg_protocol);
      }
      *(undefined4 *)((long)&psVar4[4].dispname + 4) = 1;
    }
    local_198 = &psigtype_nid;
    do {
      iVar6 = *(int *)((long)pvVar1 + 0xac);
      if (iVar6 != 1) {
        if (iVar6 == 2) {
          psVar4 = (ssl_peer *)cf->ctx;
          CVar8 = Curl_oss_check_peer_cert(cf,data,(ossl_ctx *)psVar4[1].dispname,psVar4);
          if (CVar8 != CURLE_OK) {
            return CVar8;
          }
          *(undefined4 *)((long)&psVar4[4].dispname + 4) = 3;
          iVar6 = *(int *)((long)pvVar1 + 0xac);
        }
        if (iVar6 == 3) {
          *(undefined4 *)((long)pvVar1 + 0xa8) = 3;
        }
        *local_190 = iVar6 == 3;
        *(undefined4 *)((long)pvVar1 + 0xac) = 0;
        return CURLE_OK;
      }
      tVar9 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar9 < 0) goto LAB_00168bcb;
      if ((!nonblocking) && (uVar7 = *(uint *)((long)pvVar1 + 0xb4), uVar7 != 0)) {
        iVar6 = Curl_socket_check(-(uint)((uVar7 & 1) == 0) | uVar5,-1,
                                  -(uint)((uVar7 & 2) == 0) | uVar5,tVar9);
        if (iVar6 < 0) {
          puVar17 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar17);
          return CURLE_SSL_CONNECT_ERROR;
        }
        if (iVar6 == 0) goto LAB_00168bcb;
      }
      connssl = (ssl_connect_data *)cf->ctx;
      puVar2 = (undefined8 *)connssl->backend;
      psVar10 = Curl_ssl_cf_get_config(cf,data);
      connssl->io_need = 0;
      ERR_clear_error();
      uVar7 = SSL_connect((SSL *)puVar2[1]);
      if ((*(byte *)((long)puVar2 + 0x25) & 1) == 0) {
        CVar8 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar2);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        *(byte *)((long)puVar2 + 0x25) = *(byte *)((long)puVar2 + 0x25) | 1;
      }
      if (uVar7 == 1) {
        _psigtype_nid = _psigtype_nid & 0xffffffff00000000;
        connssl->connecting_state = ssl_connect_3;
        SSL_get_peer_signature_type_nid(puVar2[1],&psigtype_nid);
        lVar11 = SSL_ctrl((SSL *)puVar2[1],0x86,0,(void *)0x0);
        pcVar12 = OBJ_nid2sn((uint)lVar11 & 0xffff);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          pcVar13 = SSL_get_version((SSL *)puVar2[1]);
          c = SSL_get_current_cipher((SSL *)puVar2[1]);
          pcVar14 = SSL_CIPHER_get_name(c);
          if (pcVar12 == (char *)0x0) {
            pcVar12 = "[blank]";
          }
          pcVar15 = OBJ_nid2sn(psigtype_nid);
          Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar13,pcVar14,pcVar12,pcVar15);
        }
        if (connssl->alpn != (alpn_spec *)0x0) {
          SSL_get0_alpn_selected(puVar2[1],&neg_protocol,&local_19c);
          CVar8 = Curl_alpn_set_negotiated(cf,data,connssl,neg_protocol,(ulong)local_19c);
          if (CVar8 != CURLE_OK) {
            return CVar8;
          }
        }
      }
      else {
        err = SSL_get_error((SSL *)puVar2[1],uVar7);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ) && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar7,(ulong)err);
        }
        if (err == 0xc) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
               (0 < pcVar3->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"SSL_connect() -> want retry_verify");
          }
          connssl->io_need = 1;
          connssl->connecting_state = ssl_connect_2;
        }
        else if (err == 3) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
               (0 < pcVar3->log_level)) && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"SSL_connect() -> want send");
          }
          connssl->io_need = 2;
        }
        else if (err == 9) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
               (0 < pcVar3->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"SSL_connect() -> want async");
          }
          connssl->io_need = 1;
          connssl->connecting_state = ssl_connect_2;
        }
        else {
          if (err != 2) {
            memset(&neg_protocol,0,0x100);
            connssl->connecting_state = ssl_connect_2;
            error = ERR_get_error();
            uVar5 = (uint)error;
            if ((uVar5 & 0xff800000) == 0xa000000 && -1 < (int)uVar5) {
              uVar5 = uVar5 & 0x7fffff;
              if (uVar5 != 0x86) {
                if (uVar5 == 0x45c) {
                  ossl_strerror(error,(char *)&neg_protocol,0x100);
                  CVar8 = CURLE_SSL_CLIENTCERT;
                  goto LAB_00168f61;
                }
                if (uVar5 != 0x415) goto LAB_00168eb0;
              }
              lVar11 = SSL_get_verify_result((SSL *)puVar2[1]);
              if (lVar11 == 0) {
                Curl_failf(data,"%s","SSL certificate verification failed");
                return CURLE_PEER_FAILED_VERIFICATION;
              }
              psVar10->certverifyresult = lVar11;
              pcVar12 = X509_verify_cert_error_string(lVar11);
              curl_msnprintf((char *)&neg_protocol,0x100,"SSL certificate problem: %s",pcVar12);
              CVar8 = CURLE_PEER_FAILED_VERIFICATION;
LAB_00168f61:
              Curl_failf(data,"%s",&neg_protocol);
              return CVar8;
            }
LAB_00168eb0:
            ossl_strerror(error,(char *)&neg_protocol,0x100);
            if (error != 0) {
              CVar8 = CURLE_SSL_CONNECT_ERROR;
              goto LAB_00168f61;
            }
            local_148 = 0;
            uStack_140 = 0;
            local_158 = 0;
            uStack_150 = 0;
            local_168 = 0;
            uStack_160 = 0;
            local_178 = 0;
            uStack_170 = 0;
            _psigtype_nid = 0;
            uStack_180 = 0;
            piVar18 = __errno_location();
            if ((*piVar18 != 0) && (err == 5)) {
              Curl_strerror(*piVar18,(char *)&psigtype_nid,0x50);
              if ((char)psigtype_nid != '\0') goto LAB_00168f28;
            }
            local_198 = (int *)SSL_ERROR_to_str(err);
LAB_00168f28:
            Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",local_198,
                       (connssl->peer).hostname,(ulong)(uint)(connssl->peer).port);
            return CURLE_SSL_CONNECT_ERROR;
          }
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
               (0 < pcVar3->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"SSL_connect() -> want recv");
          }
          connssl->io_need = 1;
        }
      }
    } while ((!nonblocking) || (*(int *)((long)pvVar1 + 0xac) != 1));
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we are allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it is available. */
    if(!nonblocking && connssl->io_need) {
      curl_socket_t writefd = (connssl->io_need & CURL_SSL_IO_NEED_SEND) ?
        sockfd : CURL_SOCKET_BAD;
      curl_socket_t readfd = (connssl->io_need & CURL_SSL_IO_NEED_RECV) ?
        sockfd : CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking && (ssl_connect_2 == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}